

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# network.cpp
# Opt level: O3

void __thiscall network::Network::setPort(Network *this,unsigned_short port)

{
  bool bVar1;
  _func_int ***ppp_Var2;
  uint uVar3;
  int iVar4;
  ulong uVar5;
  uchar op [8];
  wait_handler<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_2_sha[P]P2P_chat_src_network_network_cpp:115:3),_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  *op_00;
  runtime_error *this_00;
  ulong uVar6;
  ulong __val;
  execution_context eVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  service *psVar10;
  uint __len;
  long in_FS_OFFSET;
  io_service service;
  string testQuery;
  string res;
  deadline_timer stopTimer;
  socket sock;
  deadline_timer queryTimer;
  char buf [1024];
  io_context local_628;
  string local_618;
  io_service *local_5f8;
  undefined8 local_5f0;
  code *local_5e8;
  code *local_5e0;
  undefined1 *local_5d8;
  size_t local_5d0;
  undefined1 local_5c8;
  undefined7 uStack_5c7;
  error_code local_5b8;
  undefined1 local_5a8 [8];
  wait_handler<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_2_sha[P]P2P_chat_src_network_network_cpp:115:3),_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  *local_5a0;
  wait_handler<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_2_sha[P]P2P_chat_src_network_network_cpp:115:3),_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  *pwStack_598;
  error_category *local_590;
  _Alloc_hider local_588;
  size_type local_580;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_578;
  undefined1 local_568 [16];
  undefined1 uStack_558;
  undefined7 uStack_557;
  per_timer_data local_550;
  executor_type local_528;
  undefined1 local_4f8 [80];
  io_object_impl<boost::asio::detail::deadline_timer_service<boost::asio::time_traits<boost::posix_time::ptime>_>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  local_4a8;
  undefined1 local_438 [1032];
  
  boost::asio::io_context::io_context(&local_628);
  this->port_ = port;
  uVar5 = time((time_t *)0x0);
  __val = -uVar5;
  if (0 < (long)uVar5) {
    __val = uVar5;
  }
  __len = 1;
  if (9 < __val) {
    uVar6 = __val;
    uVar3 = 4;
    do {
      __len = uVar3;
      if (uVar6 < 100) {
        __len = __len - 2;
        goto LAB_0014bfcf;
      }
      if (uVar6 < 1000) {
        __len = __len - 1;
        goto LAB_0014bfcf;
      }
      if (uVar6 < 10000) goto LAB_0014bfcf;
      bVar1 = 99999 < uVar6;
      uVar6 = uVar6 / 10000;
      uVar3 = __len + 4;
    } while (bVar1);
    __len = __len + 1;
  }
LAB_0014bfcf:
  local_618._M_dataplus._M_p = (pointer)&local_618.field_2;
  std::__cxx11::string::_M_construct((ulong)&local_618,(char)__len - (char)((long)uVar5 >> 0x3f));
  std::__detail::__to_chars_10_impl<unsigned_long>
            (local_618._M_dataplus._M_p + -((long)uVar5 >> 0x3f),__len,__val);
  local_5d8 = &local_5c8;
  local_5d0 = 0;
  local_5c8 = 0;
  memset(local_438,0,0x400);
  local_568._0_8_ = (impl_type)0x186a0;
  boost::asio::
  basic_deadline_timer<boost::posix_time::ptime,_boost::asio::time_traits<boost::posix_time::ptime>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  ::basic_deadline_timer<boost::asio::io_context>
            ((basic_deadline_timer<boost::posix_time::ptime,_boost::asio::time_traits<boost::posix_time::ptime>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
              *)&local_4a8,&local_628,(duration_type *)local_568,(type *)0x0);
  local_568._0_8_ = local_4f8;
  if (*(long *)(in_FS_OFFSET + -8) == 0) {
    uVar8 = 0;
  }
  else {
    uVar8 = *(undefined8 *)(*(long *)(in_FS_OFFSET + -8) + 8);
  }
  local_4f8._0_8_ = this;
  local_4f8._8_8_ = &local_618;
  op = (uchar  [8])
       boost::asio::detail::thread_info_base::
       allocate<boost::asio::detail::thread_info_base::default_tag>(uVar8,0x68);
  *(undefined8 *)op = 0;
  *(code **)((long)op + 8) =
       boost::asio::detail::
       wait_handler<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/2-sha[P]P2P-chat/src/network/network.cpp:108:3),_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
       ::do_complete;
  *(uint *)((long)op + 0x10) = 0;
  ((error_code *)((long)op + 0x18))->val_ = 0;
  *(bool *)((long)op + 0x1c) = false;
  *(error_category **)((long)op + 0x20) =
       (error_category *)&boost::system::detail::cat_holder<void>::system_category_instance;
  (((wait_op *)((long)op + 0x28))->super_operation).next_ = (scheduler_operation *)local_4f8._0_8_;
  *(undefined8 *)((long)op + 0x30) = local_4f8._8_8_;
  local_568._8_8_ = op;
  boost::asio::detail::
  handler_work_base<boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>,_void,_boost::asio::io_context,_boost::asio::executor,_void>
  ::handler_work_base((handler_work_base<boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>,_void,_boost::asio::io_context,_boost::asio::executor,_void>
                       *)((long)op + 0x38),&local_4a8.executor_);
  local_4a8.implementation_.might_have_pending_waits = true;
  _uStack_558 = op;
  boost::asio::detail::epoll_reactor::
  schedule_timer<boost::asio::time_traits<boost::posix_time::ptime>>
            ((local_4a8.service_)->scheduler_,&(local_4a8.service_)->timer_queue_,
             &local_4a8.implementation_.expiry,&local_4a8.implementation_.timer_data,(wait_op *)op);
  local_568[8] = '\0';
  local_568[9] = '\0';
  local_568[10] = '\0';
  local_568[0xb] = '\0';
  local_568[0xc] = '\0';
  local_568[0xd] = '\0';
  local_568[0xe] = '\0';
  local_568[0xf] = '\0';
  _uStack_558 = (wait_handler<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_2_sha[P]P2P_chat_src_network_network_cpp:108:3),_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
                 *)0x0;
  boost::asio::detail::
  wait_handler<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/2-sha[P]P2P-chat/src/network/network.cpp:108:3),_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  ::ptr::reset((ptr *)local_568);
  local_550.op_queue_.front_._0_4_ = 0;
  local_568[8] = '\0';
  local_568[9] = '\0';
  local_568[10] = '\0';
  local_568[0xb] = '\0';
  local_568[0xc] = '\0';
  local_568[0xd] = '\0';
  local_568[0xe] = '\0';
  local_568[0xf] = '\0';
  _uStack_558 = (wait_handler<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_2_sha[P]P2P_chat_src_network_network_cpp:108:3),_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
                 *)0x0;
  local_568._2_2_ = this->port_ << 8 | this->port_ >> 8;
  local_568._0_2_ = 2;
  local_568._4_4_ = 0;
  boost::asio::
  basic_socket<boost::asio::ip::udp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  ::basic_socket<boost::asio::io_context>
            ((basic_socket<boost::asio::ip::udp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
              *)local_4f8,&local_628,(endpoint_type *)local_568,(type *)0x0);
  local_5a8 = (undefined1  [8])0x30d40;
  boost::asio::
  basic_deadline_timer<boost::posix_time::ptime,_boost::asio::time_traits<boost::posix_time::ptime>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  ::basic_deadline_timer<boost::asio::io_context>
            ((basic_deadline_timer<boost::posix_time::ptime,_boost::asio::time_traits<boost::posix_time::ptime>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
              *)local_568,&local_628,(duration_type *)local_5a8,(type *)0x0);
  uVar8 = local_568._0_8_;
  if (*(long *)(in_FS_OFFSET + -8) == 0) {
    uVar9 = 0;
  }
  else {
    uVar9 = *(undefined8 *)(*(long *)(in_FS_OFFSET + -8) + 8);
  }
  local_5f8 = &local_628;
  local_5a8 = (undefined1  [8])&local_5f8;
  op_00 = (wait_handler<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_2_sha[P]P2P_chat_src_network_network_cpp:115:3),_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
           *)boost::asio::detail::thread_info_base::
             allocate<boost::asio::detail::thread_info_base::default_tag>(uVar9,0x60);
  (op_00->super_wait_op).super_operation.next_ = (scheduler_operation *)0x0;
  (op_00->super_wait_op).super_operation.func_ =
       boost::asio::detail::
       wait_handler<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/2-sha[P]P2P-chat/src/network/network.cpp:115:3),_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
       ::do_complete;
  (op_00->super_wait_op).super_operation.task_result_ = 0;
  (op_00->super_wait_op).ec_.val_ = 0;
  (op_00->super_wait_op).ec_.failed_ = false;
  (op_00->super_wait_op).ec_.cat_ =
       (error_category *)&boost::system::detail::cat_holder<void>::system_category_instance;
  (op_00->handler_).service = local_5f8;
  local_5a0 = op_00;
  boost::asio::detail::
  handler_work_base<boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>,_void,_boost::asio::io_context,_boost::asio::executor,_void>
  ::handler_work_base(&(op_00->work_).
                       super_handler_work_base<boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>,_void,_boost::asio::io_context,_boost::asio::executor,_void>
                      ,&local_528);
  uStack_558 = 1;
  pwStack_598 = op_00;
  boost::asio::detail::epoll_reactor::
  schedule_timer<boost::asio::time_traits<boost::posix_time::ptime>>
            (*(epoll_reactor **)(uVar8 + 0x68),
             (timer_queue<boost::asio::time_traits<boost::posix_time::ptime>_> *)(uVar8 + 0x28),
             (time_type *)(local_568 + 8),&local_550,(wait_op *)op_00);
  local_5a0 = (wait_handler<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_2_sha[P]P2P_chat_src_network_network_cpp:115:3),_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
               *)0x0;
  pwStack_598 = (wait_handler<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_2_sha[P]P2P_chat_src_network_network_cpp:115:3),_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
                 *)0x0;
  boost::asio::detail::
  wait_handler<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/2-sha[P]P2P-chat/src/network/network.cpp:115:3),_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  ::ptr::reset((ptr *)local_5a8);
  local_5f0 = 0;
  local_5f8 = (io_service *)operator_new(0x20);
  (local_5f8->super_execution_context).service_registry_ = (service_registry *)&local_5d8;
  local_5f8->impl_ = (impl_type *)local_438;
  local_5f8[1].super_execution_context.service_registry_ = (service_registry *)local_4f8;
  local_5f8[1].impl_ = (impl_type *)&local_5f8;
  local_5e0 = std::
              _Function_handler<void_(const_boost::system::error_code_&,_unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/2-sha[P]P2P-chat/src/network/network.cpp:118:3)>
              ::_M_invoke;
  local_5e8 = std::
              _Function_handler<void_(const_boost::system::error_code_&,_unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/2-sha[P]P2P-chat/src/network/network.cpp:118:3)>
              ::_M_manager;
  local_5a0 = (wait_handler<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_2_sha[P]P2P_chat_src_network_network_cpp:115:3),_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
               *)0x400;
  local_5b8._0_8_ = (service_registry *)local_4f8;
  local_5a8 = (undefined1  [8])local_438;
  boost::asio::
  basic_datagram_socket<boost::asio::ip::udp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>
  ::initiate_async_receive::operator()
            ((initiate_async_receive *)&local_5b8,
             (function<void_(const_boost::system::error_code_&,_unsigned_long)> *)&local_5f8,
             (mutable_buffers_1 *)local_5a8,0);
  local_5b8._0_8_ = local_5b8._0_8_ & 0xffffff0000000000;
  local_5b8.cat_ =
       (error_category *)&boost::system::detail::cat_holder<void>::system_category_instance;
  boost::asio::detail::scheduler::run(local_628.impl_,&local_5b8);
  local_590 = local_5b8.cat_;
  uVar8 = local_5b8._0_8_;
  if (local_5b8.failed_ == true) {
    std::runtime_error::runtime_error((runtime_error *)local_5a8,"");
    local_588._M_p = (pointer)&local_578;
    local_5a8 = (undefined1  [8])&PTR__system_error_0016ec10;
    pwStack_598 = (wait_handler<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_2_sha[P]P2P_chat_src_network_network_cpp:115:3),_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
                   *)uVar8;
    local_580 = 0;
    local_578._M_local_buf[0] = '\0';
    boost::throw_exception<boost::system::system_error>((system_error *)local_5a8);
  }
  if (local_618._M_string_length != local_5d0) {
LAB_0014c435:
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"Access denied");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (local_618._M_string_length != 0) {
    iVar4 = bcmp(local_618._M_dataplus._M_p,local_5d8,local_618._M_string_length);
    if (iVar4 != 0) goto LAB_0014c435;
  }
  if (local_5e8 != (code *)0x0) {
    (*local_5e8)(&local_5f8,&local_5f8,3);
  }
  boost::asio::detail::
  io_object_impl<boost::asio::detail::deadline_timer_service<boost::asio::time_traits<boost::posix_time::ptime>_>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  ::~io_object_impl((io_object_impl<boost::asio::detail::deadline_timer_service<boost::asio::time_traits<boost::posix_time::ptime>_>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
                     *)local_568);
  boost::asio::detail::
  io_object_impl<boost::asio::detail::reactive_socket_service<boost::asio::ip::udp>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  ::~io_object_impl((io_object_impl<boost::asio::detail::reactive_socket_service<boost::asio::ip::udp>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
                     *)local_4f8);
  boost::asio::detail::
  io_object_impl<boost::asio::detail::deadline_timer_service<boost::asio::time_traits<boost::posix_time::ptime>_>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  ::~io_object_impl(&local_4a8);
  if (local_5d8 != &local_5c8) {
    operator_delete(local_5d8,CONCAT71(uStack_5c7,local_5c8) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_618._M_dataplus._M_p != &local_618.field_2) {
    operator_delete(local_618._M_dataplus._M_p,local_618.field_2._M_allocated_capacity + 1);
  }
  psVar10 = (local_628.super_execution_context.service_registry_)->first_service_;
  eVar7.service_registry_ = local_628.super_execution_context.service_registry_;
  if (psVar10 != (service *)0x0) {
    do {
      (*psVar10->_vptr_service[2])(psVar10);
      eVar7.service_registry_ = local_628.super_execution_context.service_registry_;
      psVar10 = psVar10->next_;
    } while (psVar10 != (service *)0x0);
    psVar10 = (local_628.super_execution_context.service_registry_)->first_service_;
    if (psVar10 != (service *)0x0) {
      do {
        ppp_Var2 = &psVar10->_vptr_service;
        psVar10 = psVar10->next_;
        (*(*ppp_Var2)[1])();
        (eVar7.service_registry_)->first_service_ = psVar10;
      } while (psVar10 != (service *)0x0);
      eVar7.service_registry_ = local_628.super_execution_context.service_registry_;
      if (local_628.super_execution_context.service_registry_ == (service_registry *)0x0) {
        eVar7.service_registry_ = (service_registry *)0x0;
        goto LAB_0014c412;
      }
    }
  }
  pthread_mutex_destroy((pthread_mutex_t *)&(eVar7.service_registry_)->mutex_);
LAB_0014c412:
  operator_delete(eVar7.service_registry_,0x40);
  return;
}

Assistant:

void Network::setPort(const unsigned short port)
{
	boost::asio::io_service service;
	port_ = port;
	std::string testQuery = std::to_string(time(0));
	std::string res;
	char buf[PACKAGE_SIZE];
	memset(buf, 0, PACKAGE_SIZE);

	// Timer waits receiver start
	boost::asio::deadline_timer queryTimer(service, boost::posix_time::milliseconds(100));
	queryTimer.async_wait(
		[&](const boost::system::error_code &ex) { sendBroadcast(testQuery); }
	);
	
	// Receive test query
	udp::socket sock(service, udp::endpoint(udp::v4(), port_));
	boost::asio::deadline_timer stopTimer(service, boost::posix_time::milliseconds(200));
	stopTimer.async_wait(
		[&service](const boost::system::error_code &ex) { service.stop(); }
	);
	std::function<void(const boost::system::error_code&, std::size_t)> onRead =
		[&](const boost::system::error_code &err, std::size_t read_bytes)
	{
		res = buf;
		memset(buf, 0, PACKAGE_SIZE);
		sock.async_receive(boost::asio::buffer(buf, PACKAGE_SIZE), onRead);
	};
	sock.async_receive(boost::asio::buffer(buf, PACKAGE_SIZE), onRead);
	service.run();

	if (testQuery != res)
		throw std::runtime_error("Access denied");
}